

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O3

void __thiscall
gl4cts::TextureFilterMinmaxUtils::SupportedTextureType::SupportedTextureType
          (SupportedTextureType *this,GLenum type,string *shaderTexcoordType,
          string *shaderSamplerType)

{
  string *str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SupportedTextureType *this_00;
  SupportedTextureType *this_01;
  SupportedTextureType *this_02;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this_00 = (SupportedTextureType *)&local_58;
  this_01 = (SupportedTextureType *)&local_58;
  this_02 = (SupportedTextureType *)&local_58;
  this->_vptr_SupportedTextureType = (_func_int **)&PTR___cxa_pure_virtual_020e0588;
  this->m_type = type;
  (this->m_size).m_data[0] = 0;
  (this->m_size).m_data[1] = 0;
  (this->m_size).m_data[2] = 0;
  local_38 = &(this->m_vertexShader).field_2;
  (this->m_vertexShader)._M_dataplus._M_p = (pointer)local_38;
  (this->m_vertexShader)._M_string_length = 0;
  (this->m_vertexShader).field_2._M_local_buf[0] = '\0';
  str = &this->m_fragmentShader;
  (this->m_fragmentShader)._M_dataplus._M_p = (pointer)&(this->m_fragmentShader).field_2;
  (this->m_fragmentShader)._M_string_length = 0;
  (this->m_fragmentShader).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&this->m_vertexShader,0,(char *)0x0,0x1a99138);
  std::__cxx11::string::_M_replace
            ((ulong)str,0,(char *)(this->m_fragmentShader)._M_string_length,0x1a991f1);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"<texcoord_type>","");
  replaceAll(this_00,&this->m_vertexShader,&local_58,shaderTexcoordType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"<texcoord_type>","");
  replaceAll(this_01,str,&local_58,shaderTexcoordType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"<sampler_type>","");
  replaceAll(this_02,str,&local_58,shaderSamplerType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TextureFilterMinmaxUtils::SupportedTextureType::SupportedTextureType(glw::GLenum		type,
																	 const std::string& shaderTexcoordType,
																	 const std::string& shaderSamplerType)
	: m_type(type)
{
	m_vertexShader = "#version 450 core\n"
					 "in highp vec2 position;\n"
					 "in <texcoord_type> inTexcoord;\n"
					 "out <texcoord_type> texcoord;\n"
					 "void main()\n"
					 "{\n"
					 "	texcoord = inTexcoord;\n"
					 "	gl_Position = vec4(position, 0.0, 1.0);\n"
					 "}\n";

	m_fragmentShader = "#version 450 core\n"
					   "uniform <sampler_type> sampler;\n"
					   "in <texcoord_type> texcoord;\n"
					   "out vec4 color;\n"
					   "void main()\n"
					   "{\n"
					   "	color = texture(sampler, texcoord);\n"
					   "}\n";

	replaceAll(m_vertexShader, "<texcoord_type>", shaderTexcoordType);
	replaceAll(m_fragmentShader, "<texcoord_type>", shaderTexcoordType);
	replaceAll(m_fragmentShader, "<sampler_type>", shaderSamplerType);
}